

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mprog.c
# Opt level: O3

bool death_prog_inner_guardian(CHAR_DATA *mob,CHAR_DATA *killer)

{
  short sVar1;
  OBJ_DATA *pOVar2;
  bool bVar3;
  CHAR_DATA *ch;
  OBJ_DATA *obj;
  char buf [4608];
  char local_1238 [4616];
  
  do_cb(mob,"Alas, my life has come to an end.");
  pOVar2 = mob->carrying;
  while (obj = pOVar2, obj != (OBJ_DATA *)0x0) {
    pOVar2 = obj->next_content;
    bVar3 = isCabalItem(obj);
    if (bVar3) {
      sVar1 = obj->pIndexData->cabal;
      bVar3 = true;
      if (sVar1 != mob->cabal) {
        ch = get_cabal_guardian((int)sVar1);
        if (ch != (CHAR_DATA *)0x0) {
          bVar3 = false;
          sprintf(local_1238,"As %s falls, %s returns to %s!",mob->short_descr,obj->short_descr,
                  ch->short_descr);
          obj_from_char(obj);
          obj_to_char(obj,ch);
          act(local_1238,mob,(void *)0x0,(void *)0x0,4);
          cabal_shudder((int)obj->pIndexData->cabal,false);
        }
      }
      save_cabal_items();
      if ((bVar3) || (obj->pIndexData->cabal == mob->cabal)) {
        act("As $N falls, $p appears in $n\'s hands!",killer,obj,mob,0);
        act("As $N falls, $p appears in your hands!",killer,obj,mob,3);
        obj->timer = 0x15;
        obj_from_char(obj);
        obj_to_char(obj,killer);
      }
    }
  }
  return false;
}

Assistant:

bool death_prog_inner_guardian(CHAR_DATA *mob, CHAR_DATA *killer)
{
	OBJ_DATA *obj, *obj_next;
	char buf[MSL];
	bool found= false;
	CHAR_DATA *cabalguardian;

	do_cb(mob, "Alas, my life has come to an end.");

	for (obj = mob->carrying; obj != nullptr; obj = obj_next)
	{
		found= false;
		obj_next = obj->next_content;

		if (!isCabalItem(obj))
			continue;

		if (obj->pIndexData->cabal != mob->cabal)
		{
			cabalguardian = get_cabal_guardian(obj->pIndexData->cabal);
			if (cabalguardian)
			{
				sprintf(buf, "As %s falls, %s returns to %s!",
					mob->short_descr,
					obj->short_descr,
					cabalguardian->short_descr);

				obj_from_char(obj);
				obj_to_char(obj, cabalguardian);

				found = true;

				act(buf, mob, 0, 0, TO_ALL);
				cabal_shudder(obj->pIndexData->cabal, false);
			}
		}

		save_cabal_items();

		if (obj->pIndexData->cabal == mob->cabal || !found)
		{
			act("As $N falls, $p appears in $n's hands!", killer, obj, mob, TO_ROOM);
			act("As $N falls, $p appears in your hands!", killer, obj, mob, TO_CHAR);

			obj->timer = 21;

			obj_from_char(obj);
			obj_to_char(obj, killer);
		}
	}

	return false;
}